

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O1

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImDrawList *pIVar5;
  ImDrawCmd *pIVar6;
  code *pcVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  int fb_height;
  long lVar12;
  int fb_width;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  GLuint vertex_array_object;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLenum last_clip_origin;
  GLint last_polygon_mode [2];
  GLuint local_a4;
  int local_a0;
  float local_9c;
  GLenum local_98;
  GLenum local_94;
  GLenum local_90;
  GLenum local_8c;
  GLenum local_88;
  GLenum local_84;
  GLuint local_80;
  GLuint local_7c;
  GLuint local_78;
  undefined4 local_74;
  GLuint local_70;
  GLenum local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  int local_3c;
  undefined4 local_38 [2];
  
  fb_width = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  fb_height = (int)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  if (0 < fb_height && 0 < fb_width) {
    glGetIntegerv(0x84e0,&local_6c);
    (*__glewActiveTexture)(0x84c0);
    glGetIntegerv(0x8b8d,&local_70);
    glGetIntegerv(0x8069,&local_74);
    glGetIntegerv(0x8919,&local_78);
    glGetIntegerv(0x8894,&local_7c);
    glGetIntegerv(0x85b5,&local_80);
    glGetIntegerv(0xb40,local_38);
    glGetIntegerv(0xba2,&local_58);
    glGetIntegerv(0xc10,&local_68);
    glGetIntegerv(0x80c9,&local_84);
    glGetIntegerv(0x80c8,&local_88);
    glGetIntegerv(0x80cb,&local_8c);
    glGetIntegerv(0x80ca,&local_90);
    glGetIntegerv(0x8009,&local_94);
    glGetIntegerv(0x883d,&local_98);
    cVar8 = glIsEnabled(0xbe2);
    cVar9 = glIsEnabled(0xb44);
    cVar10 = glIsEnabled(0xb71);
    cVar11 = glIsEnabled(0xc11);
    local_3c = 0;
    glGetIntegerv(0x935c,&local_3c);
    local_a0 = local_3c;
    local_a4 = 0;
    (*__glewGenVertexArrays)(1,&local_a4);
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,local_a4);
    if (0 < draw_data->CmdListsCount) {
      fVar1 = (draw_data->DisplayPos).x;
      fVar2 = (draw_data->DisplayPos).y;
      fVar3 = (draw_data->FramebufferScale).x;
      local_9c = (float)fb_width;
      fVar4 = (draw_data->FramebufferScale).y;
      lVar14 = 0;
      do {
        pIVar5 = draw_data->CmdLists[lVar14];
        (*__glewBufferData)(0x8892,(long)(pIVar5->VtxBuffer).Size * 0x14,(pIVar5->VtxBuffer).Data,
                            0x88e0);
        (*__glewBufferData)(0x8893,(long)(pIVar5->IdxBuffer).Size * 2,(pIVar5->IdxBuffer).Data,
                            0x88e0);
        if (0 < (pIVar5->CmdBuffer).Size) {
          lVar12 = 0;
          lVar13 = 0;
          do {
            pIVar6 = (pIVar5->CmdBuffer).Data;
            pcVar7 = *(code **)((long)&pIVar6->UserCallback + lVar12);
            if (pcVar7 == (code *)0x0) {
              fVar15 = (*(float *)((long)&(pIVar6->ClipRect).x + lVar12) - fVar1) * fVar3;
              if ((((fVar15 < local_9c) &&
                   (fVar16 = (*(float *)((long)&(pIVar6->ClipRect).y + lVar12) - fVar2) * fVar4,
                   fVar16 < (float)fb_height)) &&
                  (fVar17 = (*(float *)((long)&(pIVar6->ClipRect).z + lVar12) - fVar1) * fVar3,
                  0.0 <= fVar17)) &&
                 (fVar18 = (*(float *)((long)&(pIVar6->ClipRect).w + lVar12) - fVar2) * fVar4,
                 0.0 <= fVar18)) {
                if (local_a0 != 0x8ca2) {
                  fVar19 = (float)fb_height - fVar18;
                  fVar17 = fVar17 - fVar15;
                  fVar18 = fVar18 - fVar16;
                  fVar16 = fVar19;
                }
                glScissor((int)fVar15,(int)fVar16,(int)fVar17,(int)fVar18);
                glBindTexture(0xde1,*(undefined4 *)((long)&pIVar6->TextureId + lVar12));
                if (g_GlVersion < 0xc80) {
                  glDrawElements(4,*(undefined4 *)((long)&pIVar6->ElemCount + lVar12),0x1403,
                                 (ulong)*(uint *)((long)&pIVar6->IdxOffset + lVar12) * 2);
                }
                else {
                  (*__glewDrawElementsBaseVertex)
                            (4,*(GLsizei *)((long)&pIVar6->ElemCount + lVar12),0x1403,
                             (void *)((ulong)*(uint *)((long)&pIVar6->IdxOffset + lVar12) * 2),
                             *(GLint *)((long)&pIVar6->VtxOffset + lVar12));
                }
              }
            }
            else if (pcVar7 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,local_a4);
            }
            else {
              (*pcVar7)(pIVar5,(long)&pIVar6->ElemCount + lVar12);
            }
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 0x38;
          } while (lVar13 < (pIVar5->CmdBuffer).Size);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < draw_data->CmdListsCount);
    }
    (*__glewDeleteVertexArrays)(1,&local_a4);
    (*__glewUseProgram)(local_70);
    glBindTexture(0xde1,local_74);
    (*__glewBindSampler)(0,local_78);
    (*__glewActiveTexture)(local_6c);
    (*__glewBindVertexArray)(local_80);
    (*__glewBindBuffer)(0x8892,local_7c);
    (*__glewBlendEquationSeparate)(local_94,local_98);
    (*__glewBlendFuncSeparate)(local_84,local_88,local_8c,local_90);
    if (cVar8 == '\0') {
      glDisable(0xbe2);
    }
    else {
      glEnable(0xbe2);
    }
    if (cVar9 == '\0') {
      glDisable(0xb44);
    }
    else {
      glEnable(0xb44);
    }
    if (cVar10 == '\0') {
      glDisable(0xb71);
    }
    else {
      glEnable(0xb71);
    }
    if (cVar11 == '\0') {
      glDisable(0xc11);
    }
    else {
      glEnable(0xc11);
    }
    glPolygonMode(0x408,local_38[0]);
    glViewport(local_58,local_54,local_50,local_4c);
    glScissor(local_68,local_64,local_60,local_5c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 3200)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}